

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

mecab_learner_node_t * __thiscall
MeCab::Tokenizer<mecab_learner_node_t,_mecab_learner_path_t>::getBOSNode
          (Tokenizer<mecab_learner_node_t,_mecab_learner_path_t> *this,
          Allocator<mecab_learner_node_t,_mecab_learner_path_t> *allocator)

{
  mecab_learner_node_t *pmVar1;
  
  pmVar1 = Allocator<mecab_learner_node_t,_mecab_learner_path_t>::newNode(allocator);
  pmVar1->surface = "BOS/EOS";
  pmVar1->feature = (this->bos_feature_).super_scoped_array<char>.ptr_;
  pmVar1->stat = '\x02';
  pmVar1->isbest = '\x01';
  return pmVar1;
}

Assistant:

N *Tokenizer<N, P>::getBOSNode(Allocator<N, P> *allocator) const {
  N *bos_node = allocator->newNode();
  bos_node->surface = const_cast<const char *>(BOS_KEY);  // dummy
  bos_node->feature = bos_feature_.get();
  bos_node->isbest = 1;
  bos_node->stat = MECAB_BOS_NODE;
  return bos_node;
}